

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_open_memory.c
# Opt level: O3

int64_t memory_read_seek(archive *a,void *client_data,int64_t offset,int whence)

{
  int64_t iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (whence == 2) {
    uVar3 = offset + *(long *)((long)client_data + 0x10);
  }
  else if (whence == 1) {
    uVar3 = offset + *(long *)((long)client_data + 8);
  }
  else {
    if (whence != 0) {
      return -0x1e;
    }
    uVar3 = offset + *client_data;
  }
  *(ulong *)((long)client_data + 8) = uVar3;
  uVar2 = *client_data;
  iVar1 = uVar3 - uVar2;
  if ((uVar3 < uVar2) || (uVar2 = *(ulong *)((long)client_data + 0x10), uVar2 < uVar3)) {
    *(ulong *)((long)client_data + 8) = uVar2;
    iVar1 = -0x19;
  }
  return iVar1;
}

Assistant:

static int64_t
memory_read_seek(struct archive *a, void *client_data, int64_t offset, int whence)
{
	struct read_memory_data *mine = (struct read_memory_data *)client_data;

	(void)a; /* UNUSED */
	switch (whence) {
	case SEEK_SET:
		mine->p = mine->start + offset;
		break;
	case SEEK_END:
		mine->p = mine->end + offset;
		break;
	case SEEK_CUR:
		mine->p += offset;
		break;
	}
	if (mine->p < mine->start) {
		mine->p = mine->start;
		return ARCHIVE_FAILED;
	}
	if (mine->p > mine->end) {
		mine->p = mine->end;
		return ARCHIVE_FAILED;
	}
	return (mine->p - mine->start);
}